

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall HighsDomain::backtrackToGlobal(HighsDomain *this)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  Reason reason;
  pointer pHVar4;
  pointer ppVar5;
  pointer pRVar6;
  pointer piVar7;
  bool bVar8;
  vector<int,_std::allocator<int>_> *pvVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  HighsDomainChange local_40;
  int iVar16;
  
  uVar13 = (ulong)((long)(this->domchgstack_).
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->domchgstack_).
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 4;
  bVar3 = this->infeasible_;
  reason = this->infeasible_reason;
  uVar11 = (uint)uVar13;
  if ((bVar3 == true) && (this->infeasible_pos == uVar11)) {
    this->infeasible_ = false;
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
  }
  if (0 < (int)uVar11) {
    lVar10 = (ulong)(uVar11 & 0x7fffffff) * 0x10 + -8;
    uVar14 = (ulong)(uVar11 & 0x7fffffff);
    do {
      pHVar4 = (this->domchgstack_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start;
      ppVar5 = (this->prevboundval_).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar2 = *(double *)((long)ppVar5 + lVar10 + -8);
      pvVar9 = &this->colUpperPos_;
      if (*(int *)((long)&pHVar4->boundval + lVar10 + 4) == 0) {
        pvVar9 = &this->colLowerPos_;
      }
      (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[*(int *)((long)&pHVar4->boundval + lVar10)] = *(int *)((long)&ppVar5->first + lVar10)
      ;
      pdVar1 = (double *)((long)pHVar4 + lVar10 + -8);
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        local_40._8_8_ = *(undefined8 *)((long)&pHVar4->boundval + lVar10);
        local_40.boundval = dVar2;
        doChangeBound(this,&local_40);
      }
      uVar13 = uVar14 - 1;
      if ((this->infeasible_ == true) && (uVar13 == (uint)this->infeasible_pos)) {
        this->infeasible_ = false;
        (this->infeasible_reason).type = -2;
        (this->infeasible_reason).index = 0;
      }
      lVar10 = lVar10 + -0x10;
      bVar8 = 1 < (long)uVar14;
      uVar14 = uVar13;
    } while (bVar8);
  }
  if (bVar3 != false) {
    markPropagateCut(this,reason);
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
    this->infeasible_ = false;
  }
  iVar12 = (int)uVar13;
  iVar16 = (int)((ulong)((long)(this->domchgreason_).
                               super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->domchgreason_).
                              super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  iVar15 = iVar16 - iVar12;
  if (iVar15 != 0 && iVar12 <= iVar16) {
    lVar10 = (long)iVar12;
    do {
      markPropagateCut(this,(this->domchgreason_).
                            super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar10]);
      lVar10 = lVar10 + 1;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  pHVar4 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar4) {
    (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar4;
  }
  ppVar5 = (this->prevboundval_).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar5) {
    (this->prevboundval_).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar5;
  }
  pRVar6 = (this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar6) {
    (this->domchgreason_).
    super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar6;
  }
  piVar7 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar7) {
    (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar7;
  }
  return;
}

Assistant:

void HighsDomain::backtrackToGlobal() {
  HighsInt k = HighsInt(domchgstack_.size()) - 1;
  bool old_infeasible = infeasible_;
  Reason old_reason = infeasible_reason;

  if (infeasible_ && infeasible_pos == HighsInt(domchgstack_.size())) {
    assert(old_infeasible);
    assert(k == HighsInt(domchgstack_.size()) - 1);
    infeasible_ = false;
    infeasible_reason = Reason::unspecified();
  }

  while (k >= 0) {
    double prevbound = prevboundval_[k].first;
    HighsInt prevpos = prevboundval_[k].second;
    assert(prevpos < k);

    mipsolver->mipdata_->debugSolution.boundChangeRemoved(*this,
                                                          domchgstack_[k]);

    if (domchgstack_[k].boundtype == HighsBoundType::kLower) {
      assert(colLowerPos_[domchgstack_[k].column] == k);
      colLowerPos_[domchgstack_[k].column] = prevpos;
    } else {
      assert(colUpperPos_[domchgstack_[k].column] == k);
      colUpperPos_[domchgstack_[k].column] = prevpos;
    }

    if (prevbound != domchgstack_[k].boundval) {
      // change back to global bound
      doChangeBound(
          {prevbound, domchgstack_[k].column, domchgstack_[k].boundtype});
    }

    if (infeasible_ && infeasible_pos == k) {
      assert(old_infeasible);
      assert(k == HighsInt(domchgstack_.size()) - 1);
      infeasible_ = false;
      infeasible_reason = Reason::unspecified();
    }

    --k;
  }

  if (old_infeasible) {
    markPropagateCut(old_reason);
    infeasible_reason = Reason::unspecified();
    infeasible_ = false;
  }

  HighsInt numreason = domchgreason_.size();
  for (HighsInt i = k + 1; i < numreason; ++i)
    markPropagateCut(domchgreason_[i]);

  domchgstack_.clear();
  prevboundval_.clear();
  domchgreason_.clear();
  branchPos_.clear();
}